

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

string * __thiscall
crsGA::LogHandler::buildOutpuMessage
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when,LogLevel level,string *str)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream msg;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  switch(level) {
  case LOG_FATAL:
    pcVar2 = "[";
    poVar1 = std::operator<<((ostream *)local_1a0,"[");
    toDateTime_abi_cxx11_(&local_1c0,(LogHandler *)pcVar2,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,"] <FATAL>:");
    std::operator<<(poVar1,(string *)str);
    break;
  case LOG_WARNING:
    pcVar2 = "[";
    poVar1 = std::operator<<((ostream *)local_1a0,"[");
    toDateTime_abi_cxx11_(&local_1c0,(LogHandler *)pcVar2,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,"] <WARNING>: ");
    std::operator<<(poVar1,(string *)str);
    break;
  case LOG_NOTICE:
    pcVar2 = "[";
    poVar1 = std::operator<<((ostream *)local_1a0,"[");
    toDateTime_abi_cxx11_(&local_1c0,(LogHandler *)pcVar2,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,"] <NOTICE>:  ");
    std::operator<<(poVar1,(string *)str);
    break;
  case LOG_DEBUG:
    pcVar2 = "[";
    poVar1 = std::operator<<((ostream *)local_1a0,"[");
    toDateTime_abi_cxx11_(&local_1c0,(LogHandler *)pcVar2,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,"] <DEBUG>:   ");
    std::operator<<(poVar1,(string *)str);
    break;
  case LOG_VERBOSE:
    pcVar2 = "[";
    poVar1 = std::operator<<((ostream *)local_1a0,"[");
    toDateTime_abi_cxx11_(&local_1c0,(LogHandler *)pcVar2,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    poVar1 = std::operator<<(poVar1,"] <VERBOSE>: ");
    std::operator<<(poVar1,(string *)str);
    break;
  default:
    goto switchD_001097b3_default;
  }
  std::__cxx11::string::~string((string *)&local_1c0);
switchD_001097b3_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::buildOutpuMessage(const std::chrono::time_point<std::chrono::system_clock>& when, LogLevel level, const std::string& str)
{
    std::ostringstream msg;
    switch (level)
    {
    case LOG_FATAL:
        msg << "[" << toDateTime(when) << "] <FATAL>:" << str;
        break;
    case LOG_WARNING:
        msg << "[" << toDateTime(when) << "] <WARNING>: " << str;
        break;
    case LOG_NOTICE:
        msg << "[" << toDateTime(when) << "] <NOTICE>:  " << str;
        break;
    case LOG_DEBUG:
        msg << "[" << toDateTime(when) << "] <DEBUG>:   " << str;
        break;
    case LOG_VERBOSE:
        msg << "[" << toDateTime(when) << "] <VERBOSE>: " << str;
        break;
    default:
        break;
    }
    return msg.str();
}